

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O3

void __thiscall
embree::TutorialApplication::setCallbackFunctions(TutorialApplication *this,GLFWwindow *window)

{
  glfwSetKeyCallback(window,embree::keyboardFunc);
  glfwSetCursorPosCallback(window,embree::motionFunc);
  glfwSetMouseButtonCallback(window,embree::clickFunc);
  glfwSetCharCallback(window,ImGui_ImplGlfw_CharCallback);
  glfwSetScrollCallback(window,ImGui_ImplGlfw_ScrollCallback);
  glfwSetWindowSizeCallback(window,embree::reshapeFunc);
  glfwSetWindowFocusCallback(window,ImGui_ImplGlfw_WindowFocusCallback);
  glfwSetCursorEnterCallback(window,ImGui_ImplGlfw_CursorEnterCallback);
  glfwSetMonitorCallback(ImGui_ImplGlfw_MonitorCallback);
  return;
}

Assistant:

void TutorialApplication::setCallbackFunctions(GLFWwindow* window)
  {
    glfwSetKeyCallback(window,embree::keyboardFunc);
    glfwSetCursorPosCallback(window,embree::motionFunc);
    glfwSetMouseButtonCallback(window,embree::clickFunc);
    glfwSetCharCallback(window, ImGui_ImplGlfw_CharCallback);
    glfwSetScrollCallback(window, ImGui_ImplGlfw_ScrollCallback);
    glfwSetWindowSizeCallback(window,embree::reshapeFunc);
    glfwSetWindowFocusCallback(window, ImGui_ImplGlfw_WindowFocusCallback);
    glfwSetCursorEnterCallback(window, ImGui_ImplGlfw_CursorEnterCallback);
    glfwSetMonitorCallback(ImGui_ImplGlfw_MonitorCallback);
  }